

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateParam(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar4) {
    local_1 = 0;
  }
  else {
    uVar5 = ParseTwoCharToken(in_stack_ffffffffffffffd8,
                              (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0))
    ;
    if ((bool)uVar5) {
      MaybeAppend((State *)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            CONCAT14(in_stack_ffffffffffffffb4,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                  ,(char *)CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
      local_1 = 1;
    }
    else {
      uVar1 = (local_10->parse_state).mangled_idx;
      uVar2 = (local_10->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
      uVar6 = ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
      if ((((bool)uVar6) &&
          (in_stack_ffffffffffffffb5 = ParseNumber((State *)copy._8_8_,(int *)copy._0_8_),
          (bool)in_stack_ffffffffffffffb5)) &&
         (in_stack_ffffffffffffffb4 =
               ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7),
         (bool)in_stack_ffffffffffffffb4)) {
        MaybeAppend((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffffffb5,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT13(in_stack_ffffffffffffffb3,
                                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffb1,
                                                  in_stack_ffffffffffffffb0))))))),
                    (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)))
        ;
        local_1 = 1;
      }
      else {
        (local_10->parse_state).mangled_idx = uVar1;
        (local_10->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar3;
        uVar7 = ParseTwoCharToken(in_stack_ffffffffffffffd8,
                                  (char *)CONCAT17(in_stack_ffffffffffffffd7,
                                                   in_stack_ffffffffffffffd0));
        if (((bool)uVar7) &&
           (uVar8 = ParseNumber((State *)copy._8_8_,(int *)copy._0_8_), (bool)uVar8)) {
          uVar9 = ParseTwoCharToken(in_stack_ffffffffffffffd8,
                                    (char *)CONCAT17(in_stack_ffffffffffffffd7,
                                                     in_stack_ffffffffffffffd0));
          if ((bool)uVar9) {
            MaybeAppend((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffffffb5,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  in_stack_ffffffffffffffb0))))))),
                        (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
            local_1 = 1;
            goto LAB_003ccbd9;
          }
          uVar10 = ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
          if ((((bool)uVar10) &&
              (uVar11 = ParseNumber((State *)copy._8_8_,(int *)copy._0_8_), (bool)uVar11)) &&
             (bVar4 = ParseOneCharToken(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7), bVar4)
             ) {
            MaybeAppend((State *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffffffb5,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  uVar10))))))),
                        (char *)CONCAT17(uVar11,CONCAT16(bVar4,in_stack_ffffffffffffffa8)));
            local_1 = 1;
            goto LAB_003ccbd9;
          }
        }
        (local_10->parse_state).mangled_idx = uVar1;
        (local_10->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar3;
        local_1 = 0;
      }
    }
  }
LAB_003ccbd9:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T_
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T <parameter-2 non-negative number> _
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "TL") && ParseNumber(state, nullptr)) {
    if (ParseTwoCharToken(state, "__")) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;              // ::= TL <level-1> __
    }

    if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
        ParseOneCharToken(state, '_')) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;  // ::= TL <level-1> _ <parameter-2 non-negative number> _
    }
  }
  state->parse_state = copy;
  return false;
}